

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hdecompress.c
# Opt level: O3

void unshuffle64(LONGLONG *a,int n,int n2,LONGLONG *tmp)

{
  long lVar1;
  LONGLONG *pLVar2;
  int iVar3;
  int iVar4;
  LONGLONG *pLVar5;
  long lVar6;
  
  iVar3 = n + 1 >> 1;
  lVar1 = (long)n2;
  if (iVar3 < n) {
    pLVar2 = a + iVar3 * n2;
    lVar6 = 0;
    do {
      tmp[lVar6] = *pLVar2;
      lVar6 = lVar6 + 1;
      pLVar2 = pLVar2 + lVar1;
    } while (n - iVar3 != (int)lVar6);
  }
  if (0 < iVar3) {
    iVar4 = (iVar3 + -1) * n2;
    pLVar2 = a + iVar4 * 2;
    pLVar5 = a + iVar4;
    do {
      *pLVar2 = *pLVar5;
      pLVar5 = pLVar5 + -lVar1;
      pLVar2 = pLVar2 + -(long)(n2 * 2);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  if (1 < n) {
    pLVar2 = a + lVar1;
    lVar1 = 0;
    do {
      *pLVar2 = *(LONGLONG *)((long)tmp + lVar1 * 4);
      pLVar2 = pLVar2 + n2 * 2;
      iVar3 = (int)lVar1;
      lVar1 = lVar1 + 2;
    } while (iVar3 + 3 < n);
  }
  return;
}

Assistant:

static void
unshuffle64(LONGLONG a[], int n, int n2, LONGLONG tmp[])
/*
LONGLONG a[];	 array to shuffle					
int n;		 number of elements to shuffle	
int n2;		 second dimension					
LONGLONG tmp[];	 scratch storage					
*/
{
int i;
int nhalf;
LONGLONG *p1, *p2, *pt;
 
	/*
	 * copy 2nd half of array to tmp
	 */
	nhalf = (n+1)>>1;
	pt = tmp;
	p1 = &a[n2*nhalf];				/* pointer to a[i]			*/
	for (i=nhalf; i<n; i++) {
		*pt = *p1;
		p1 += n2;
		pt += 1;
	}
	/*
	 * distribute 1st half of array to even elements
	 */
	p2 = &a[ n2*(nhalf-1) ];		/* pointer to a[i]			*/
	p1 = &a[(n2*(nhalf-1))<<1];		/* pointer to a[2*i]		*/
	for (i=nhalf-1; i >= 0; i--) {
		*p1 = *p2;
		p2 -= n2;
		p1 -= (n2+n2);
	}
	/*
	 * now distribute 2nd half of array (in tmp) to odd elements
	 */
	pt = tmp;
	p1 = &a[n2];					/* pointer to a[i]			*/
	for (i=1; i<n; i += 2) {
		*p1 = *pt;
		p1 += (n2+n2);
		pt += 1;
	}
}